

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_fopen(mg_connection *conn,char *path,int mode,mg_file *filep)

{
  char *path_00;
  int iVar1;
  FILE *pFVar2;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar3;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar4;
  char *__modes;
  int iVar5;
  uint8_t *c;
  
  if (CONCAT44(in_register_00000014,mode) == 0) {
    return 0;
  }
  path_00 = (char *)CONCAT44(in_register_00000014,mode);
  *(undefined8 *)(CONCAT44(in_register_00000014,mode) + 0x20) = 0;
  if (conn == (mg_connection *)0x0) {
    return 0;
  }
  if ((char)conn->connection_type == '\0') {
    return 0;
  }
  iVar1 = mg_stat(conn,path_00,(mg_file_stat *)CONCAT44(in_register_00000014,mode));
  iVar5 = (int)path;
  if (iVar5 == 1 && iVar1 == 0) {
    return 0;
  }
  if (iVar5 == 1) {
    __modes = "r";
  }
  else if (iVar5 == 4) {
    __modes = "a";
  }
  else {
    uVar3 = extraout_EDX;
    uVar4 = extraout_var;
    if (iVar5 != 2) goto LAB_001152d5;
    __modes = "w";
  }
  pFVar2 = fopen64((char *)conn,__modes);
  *(FILE **)(path_00 + 0x20) = pFVar2;
  uVar3 = extraout_EDX_00;
  uVar4 = extraout_var_00;
LAB_001152d5:
  if (iVar1 == 0) {
    mg_stat(conn,path_00,(mg_file_stat *)CONCAT44(uVar4,uVar3));
  }
  return (uint)(*(long *)(path_00 + 0x20) != 0);
}

Assistant:

static int
mg_fopen(const struct mg_connection *conn,
         const char *path,
         int mode,
         struct mg_file *filep)
{
	int found;

	if (!filep) {
		return 0;
	}
	filep->access.fp = NULL;

	if (mg_path_suspicious(conn, path)) {
		return 0;
	}

	/* filep is initialized in mg_stat: all fields with memset to,
	 * some fields like size and modification date with values */
	found = mg_stat(conn, path, &(filep->stat));

	if ((mode == MG_FOPEN_MODE_READ) && (!found)) {
		/* file does not exist and will not be created */
		return 0;
	}

#if defined(_WIN32)
	{
		wchar_t wbuf[UTF16_PATH_MAX];
		path_to_unicode(conn, path, wbuf, ARRAY_SIZE(wbuf));
		switch (mode) {
		case MG_FOPEN_MODE_READ:
			filep->access.fp = _wfopen(wbuf, L"rb");
			break;
		case MG_FOPEN_MODE_WRITE:
			filep->access.fp = _wfopen(wbuf, L"wb");
			break;
		case MG_FOPEN_MODE_APPEND:
			filep->access.fp = _wfopen(wbuf, L"ab");
			break;
		}
	}
#else
	/* Linux et al already use unicode. No need to convert. */
	switch (mode) {
	case MG_FOPEN_MODE_READ:
		filep->access.fp = fopen(path, "r");
		break;
	case MG_FOPEN_MODE_WRITE:
		filep->access.fp = fopen(path, "w");
		break;
	case MG_FOPEN_MODE_APPEND:
		filep->access.fp = fopen(path, "a");
		break;
	}

#endif
	if (!found) {
		/* File did not exist before fopen was called.
		 * Maybe it has been created now. Get stat info
		 * like creation time now. */
		found = mg_stat(conn, path, &(filep->stat));
		(void)found;
	}

	/* return OK if file is opened */
	return (filep->access.fp != NULL);
}